

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall google::protobuf::io::StringOutputStream::BackUp(StringOutputStream *this,int count)

{
  string *psVar1;
  int v1;
  int v2;
  char *pcVar2;
  LogMessage *pLVar3;
  unsigned_long t;
  LogMessage local_90;
  Voidify local_79;
  unsigned_long local_78;
  unsigned_long local_70;
  Nullable<const_char_*> local_68;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  LogMessage local_58;
  Voidify local_45 [13];
  LogMessage local_38;
  Voidify local_21;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  StringOutputStream *pSStack_10;
  int count_local;
  StringOutputStream *this_local;
  
  absl_log_internal_check_op_result._4_4_ = count;
  pSStack_10 = this;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue(count);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_20 = absl::lts_20250127::log_internal::Check_GEImpl(v1,v2,"count >= 0");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x9f,pcVar2);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  absl_log_internal_check_op_result_1._7_1_ = 0;
  if (this->target_ == (string *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xa0,"target_ != nullptr");
    absl_log_internal_check_op_result_1._7_1_ = 1;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
    absl::lts_20250127::log_internal::Voidify::operator&&(local_45,pLVar3);
  }
  if ((absl_log_internal_check_op_result_1._7_1_ & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_58);
  }
  local_70 = absl::lts_20250127::log_internal::GetReferenceableValue
                       ((long)absl_log_internal_check_op_result._4_4_);
  t = std::__cxx11::string::size();
  local_78 = absl::lts_20250127::log_internal::GetReferenceableValue(t);
  local_68 = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                       (&local_70,&local_78,"static_cast<size_t>(count) <= target_->size()");
  if (local_68 == (Nullable<const_char_*>)0x0) {
    psVar1 = this->target_;
    std::__cxx11::string::size();
    std::__cxx11::string::resize((ulong)psVar1);
    return;
  }
  pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_68);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
             ,0xa1,pcVar2);
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_90);
}

Assistant:

void StringOutputStream::BackUp(int count) {
  ABSL_CHECK_GE(count, 0);
  ABSL_CHECK(target_ != nullptr);
  ABSL_CHECK_LE(static_cast<size_t>(count), target_->size());
  target_->resize(target_->size() - count);
}